

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

int Cec_ManSimCompareConstFirstBit(uint *p,int nWords)

{
  int iVar1;
  uint uWord;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (0 < nWords) {
    uVar2 = (ulong)(uint)nWords;
  }
  if ((*p & 1) == 0) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uWord = p[uVar3];
      if (uWord != 0) {
LAB_004b3571:
        iVar1 = Gia_WordFindFirstBit(uWord);
        return iVar1 + (int)uVar3 * 0x20;
      }
    }
  }
  else {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (p[uVar3] != 0xffffffff) {
        uWord = ~p[uVar3];
        goto LAB_004b3571;
      }
    }
  }
  return -1;
}

Assistant:

int Cec_ManSimCompareConstFirstBit( unsigned * p, int nWords )
{
    int w;
    if ( p[0] & 1 )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != ~0 )
                return 32*w + Gia_WordFindFirstBit( ~p[w] );
        return -1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != 0 )
                return 32*w + Gia_WordFindFirstBit( p[w] );
        return -1;
    }
}